

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O1

int ffi2fr4(short *input,long ntodo,double scale,double zero,float *output,int *status)

{
  long lVar1;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    if (0 < ntodo) {
      lVar1 = 0;
      do {
        output[lVar1] = (float)(((double)(int)input[lVar1] - zero) / scale);
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      output[lVar1] = (float)(int)input[lVar1];
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int ffi2fr4(short *input,      /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            float *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = (float) input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (float) ((input[ii] - zero) / scale);
    }
    return(*status);
}